

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::While_AST_Node::eval_internal(While_AST_Node *this,Dispatch_State *t_ss)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  Scope_Push_Pop spp;
  Scope_Push_Pop local_58;
  undefined1 local_50 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  chaiscript::detail::Dispatch_Engine::new_scope
            ((Dispatch_Engine *)*in_RDX,(Stack_Holder *)in_RDX[1]);
  while( true ) {
    AST_Node::eval((AST_Node *)local_50,
                   (Dispatch_State *)
                   ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                   __align);
    bVar1 = AST_Node::get_bool_condition((Boxed_Value *)local_50);
    if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    }
    if (!bVar1) break;
    AST_Node::eval((AST_Node *)(local_50 + 0x10),
                   *(Dispatch_State **)
                    ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                            _M_mutex + 0x10));
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
  }
  (this->super_AST_Node)._vptr_AST_Node = (_func_int **)0x0;
  peVar2 = (element_type *)operator_new(0x50);
  (peVar2->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar2->_vptr_AST_Node = (_func_int **)&PTR___Sp_counted_ptr_inplace_003110a8;
  (peVar2->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&peVar2->identifier = 0;
  *(undefined4 *)&(peVar2->text)._M_dataplus._M_p = 0x20;
  (peVar2->text)._M_string_length = 0;
  (peVar2->text).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(peVar2->text).field_2 + 8) = 0;
  (peVar2->location).start.line = 0;
  (peVar2->location).start.column = 0;
  *(undefined2 *)&(peVar2->location).end.line = 0;
  (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->super_AST_Node)._vptr_AST_Node =
       (_func_int **)
       &(peVar2->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
        super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_58);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          try {
            while (get_bool_condition(this->children[0]->eval(t_ss))) {
              try {
                this->children[1]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // we got a continue exception, which means all of the remaining 
                // loop implementation is skipped and we just need to continue to
                // the next condition test
              }
            } 
          } catch (detail::Break_Loop &) {
            // loop was broken intentionally
          }

          return Boxed_Value();
        }